

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_ArcClose2D(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 extraout_var;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pParentElement;
  _List_node_base *p_Var10;
  pointer pcVar11;
  int pAttrIdx;
  ulong uVar12;
  string *psVar13;
  string an;
  CX3DImporter_NodeElement *ne;
  string closureType;
  string use;
  string def;
  float local_d0;
  float local_cc;
  float local_c8;
  allocator<char> local_c1;
  string local_c0;
  CX3DImporter_NodeElement *local_a0;
  string local_98;
  undefined8 local_78;
  string local_70;
  string local_50;
  undefined4 extraout_var_01;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"PIE","");
  local_a0 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  uVar12 = 0;
  if ((int)uVar7 < 1) {
    local_d0 = 0.0;
    local_c8 = 1.0;
    local_cc = 1.5707964;
  }
  else {
    local_cc = 1.5707964;
    local_c8 = 1.0;
    local_d0 = 0.0;
    local_78 = 0;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar12;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,(char *)CONCAT44(extraout_var_00,iVar8),&local_c1);
      iVar8 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar8);
        psVar13 = &local_50;
LAB_0068cf0e:
        pcVar3 = (char *)psVar13->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar13,0,pcVar3,(ulong)__s);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar8);
          psVar13 = &local_70;
          goto LAB_0068cf0e;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar8 != 0) {
          iVar8 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar8 != 0) {
            iVar8 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar8 != 0) {
              iVar8 = std::__cxx11::string::compare((char *)&local_c0);
              if (iVar8 == 0) {
                iVar8 = (*(((this->mReader)._M_t.
                            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                            .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
                __s = (char *)CONCAT44(extraout_var_03,iVar8);
                psVar13 = &local_98;
                goto LAB_0068cf0e;
              }
              iVar8 = std::__cxx11::string::compare((char *)&local_c0);
              if (iVar8 == 0) {
                local_cc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                if (iVar8 == 0) {
                  local_c8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                  if (iVar8 == 0) {
                    bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                    local_78 = CONCAT71(extraout_var,bVar6);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                    if (iVar8 == 0) {
                      local_d0 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                    }
                    else {
                      Throw_IncorrectAttr(this,&local_c0);
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      uVar12 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
    uVar12 = (ulong)((byte)local_78 & 1);
  }
  if (local_70._M_string_length != 0) {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_70,ENET_ArcClose2D,&local_a0);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_a0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
    goto LAB_0068d318;
  }
  pParentElement = (CX3DImporter_NodeElement *)operator_new(0x78);
  pCVar4 = this->NodeElement_Cur;
  pParentElement->Type = ENET_ArcClose2D;
  (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
  (pParentElement->ID)._M_string_length = 0;
  (pParentElement->ID).field_2._M_local_buf[0] = '\0';
  pParentElement->Parent = pCVar4;
  (pParentElement->Child).
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
  (pParentElement->Child).
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
  (pParentElement->Child).
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pParentElement->_vptr_CX3DImporter_NodeElement =
       (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_008da818;
  pCVar4 = pParentElement + 1;
  *(CX3DImporter_NodeElement **)&pParentElement[1].Type = pCVar4;
  pParentElement[1]._vptr_CX3DImporter_NodeElement = (_func_int **)pCVar4;
  pParentElement[1].ID._M_dataplus._M_p = (pointer)0x0;
  pParentElement[1].ID.field_2._M_local_buf[0] = '\x01';
  local_a0 = pParentElement;
  if (local_50._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
  }
  pParentElement[1].ID.field_2._M_local_buf[0] = (char)uVar12;
  GeometryHelper_Make_Arc2D
            (this,local_d0,local_cc,local_c8,10,
             (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar4);
  if (6.2831855 <= ABS(local_cc - local_d0)) {
LAB_0068d206:
    pcVar11 = pParentElement[1].ID._M_dataplus._M_p;
  }
  else {
    if ((local_cc == local_d0) && (!NAN(local_cc) && !NAN(local_d0))) goto LAB_0068d206;
    iVar8 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar8 == 0) {
LAB_0068d20c:
      p_Var9 = (_List_node_base *)operator_new(0x20);
      p_Var9[1]._M_next = (_List_node_base *)0x0;
      *(undefined4 *)&p_Var9[1]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      pParentElement[1].ID._M_dataplus._M_p = pParentElement[1].ID._M_dataplus._M_p + 1;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar8 == 0) goto LAB_0068d20c;
      iVar8 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar8 != 0) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"closureType","");
          Throw_IncorrectAttrValue(this,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    p_Var9 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
              &pCVar4->_vptr_CX3DImporter_NodeElement)->_M_impl)._M_node.super__List_node_base.
             _M_next;
    p_Var10 = (_List_node_base *)operator_new(0x20);
    *(undefined4 *)&p_Var10[1]._M_prev = *(undefined4 *)&p_Var9[1]._M_prev;
    p_Var10[1]._M_next = p_Var9[1]._M_next;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    pcVar11 = pParentElement[1].ID._M_dataplus._M_p + 1;
    pParentElement[1].ID._M_dataplus._M_p = pcVar11;
  }
  pParentElement[1].ID._M_string_length = (size_type)pcVar11;
  iVar8 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
  if ((char)iVar8 == '\0') {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ArcClose2D","");
    ParseNode_Metadata(this,pParentElement,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var9 = (_List_node_base *)operator_new(0x18);
  p_Var9[1]._M_next = (_List_node_base *)pParentElement;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  plVar5 = &this->NodeElement_List;
LAB_0068d318:
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_ArcClose2D()
{
    std::string def, use;
    std::string closureType("PIE");
    float endAngle = AI_MATH_HALF_PI_F;
    float radius = 1;
    bool solid = false;
    float startAngle = 0;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("closureType", closureType, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("endAngle", endAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("startAngle", startAngle, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ArcClose2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_ArcClose2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		// create point list of geometry object.
		GeometryHelper_Make_Arc2D(startAngle, endAngle, radius, 10, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);///TODO: IME - AI_CONFIG for NumSeg
		// add chord or two radiuses only if not a circle was defined
		if(!((std::fabs(endAngle - startAngle) >= AI_MATH_TWO_PI_F) || (endAngle == startAngle)))
		{
			std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

			if((closureType == "PIE") || (closureType == "\"PIE\""))
				vlist.push_back(aiVector3D(0, 0, 0));// center point - first radial line
			else if((closureType != "CHORD") && (closureType != "\"CHORD\""))
				Throw_IncorrectAttrValue("closureType");

			vlist.push_back(*vlist.begin());// arc first point - chord from first to last point of arc(if CHORD) or second radial line(if PIE).
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices.size();
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "ArcClose2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}